

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

NodeSequence __thiscall
GraphBuilder::insertUndefinedFunction
          (GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  NodeSequence NVar4;
  string funcName;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  auVar3 = llvm::Value::getName();
  lVar2 = auVar3._0_8_;
  if (lVar2 == 0) {
    local_30 = &local_20;
    local_28 = 0;
    local_20 = 0;
  }
  else {
    local_30 = &local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,lVar2,auVar3._8_8_ + lVar2);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  if (iVar1 == 0) {
    NVar4 = insertPthreadCreate(this,callInstruction);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_30);
    if (iVar1 == 0) {
      NVar4 = insertPthreadJoin(this,callInstruction);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_30);
      if (iVar1 == 0) {
        NVar4 = insertPthreadExit(this,callInstruction);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_30);
        if (iVar1 == 0) {
          NVar4 = insertPthreadMutexLock(this,callInstruction);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_30);
          if (iVar1 == 0) {
            NVar4 = insertPthreadMutexUnlock(this,callInstruction);
          }
          else {
            NVar4 = buildGeneralCallInstruction(this,callInstruction);
          }
        }
      }
    }
  }
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return NVar4;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertUndefinedFunction(const Function *function,
                                      const CallInst *callInstruction) {
    std::string funcName = function->getName().str();

    if (funcName == "pthread_create") {
        return insertPthreadCreate(callInstruction);
    }
    if (funcName == "pthread_join") {
        return insertPthreadJoin(callInstruction);
    }
    if (funcName == "pthread_exit") {
        return insertPthreadExit(callInstruction);
    }
    if (funcName == "pthread_mutex_lock") {
        return insertPthreadMutexLock(callInstruction);
    } else if (funcName == "pthread_mutex_unlock") {
        return insertPthreadMutexUnlock(callInstruction);
    } else {
        return buildGeneralCallInstruction(callInstruction);
    }
}